

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O2

void __thiscall
xray_re::xr_vbuf::load_d3d9(xr_vbuf *this,xr_reader *r,size_t n,d3d_vertex_element *ve,size_t n_ve)

{
  float *pfVar1;
  fcolor *pfVar2;
  short *psVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  fvector3 *pfVar6;
  fvector2 *pfVar7;
  int iVar8;
  ulong uVar9;
  size_t sVar10;
  size_t j;
  size_t sVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  fvector3 *local_60;
  fvector2 *local_58;
  fcolor *local_50;
  
  clear(this);
  sVar10 = 0;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = n;
  uVar9 = 0xffffffffffffffff;
  if (SUB168(auVar4 * ZEXT816(0xc),8) == 0) {
    uVar9 = SUB168(auVar4 * ZEXT816(0xc),0);
  }
  local_50 = this->m_colors;
  local_58 = this->m_texcoords;
  local_60 = this->m_points;
  pfVar6 = this->m_normals;
  while( true ) {
    if (n_ve == sVar10) {
      (this->super_xr_flexbuf).m_size = n;
      for (sVar10 = 0; sVar10 != n; sVar10 = sVar10 + 1) {
        iVar8 = 0;
        fVar15 = 0.0;
        fVar14 = 0.0;
        for (sVar11 = 0; n_ve != sVar11; sVar11 = sVar11 + 1) {
          switch(ve[sVar11].usage) {
          case '\0':
            xr_reader::r_fvector3(r,this->m_points + sVar10);
            break;
          case '\x03':
            r_qnormal(r,this->m_normals + sVar10);
            break;
          case '\x05':
            if (ve[sVar11].type == '\x06') {
              if (iVar8 == 0) {
                r_qtexcoord(r,this->m_texcoords + sVar10);
                iVar8 = 1;
              }
              else {
                pfVar7 = this->m_lightmaps;
                psVar3 = (r->field_2).m_p_s16;
                (r->field_2).m_p = (uint8_t *)(psVar3 + 1);
                pfVar7[sVar10].field_0.field_0.x = (float)(int)*psVar3 * 3.0517578e-05;
                psVar3 = (r->field_2).m_p_s16;
                (r->field_2).m_p = (uint8_t *)(psVar3 + 1);
                iVar8 = iVar8 + 1;
                pfVar7[sVar10].field_0.field_0.y = (float)(int)*psVar3 * 3.0517578e-05;
              }
            }
            else if (ve[sVar11].type == '\x01') {
              bVar12 = iVar8 != 0;
              iVar8 = iVar8 + 1;
              pfVar7 = (&this->m_texcoords)[bVar12];
              pfVar1 = (float *)(r->field_2).m_p_u32;
              (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
              pfVar7[sVar10].field_0.field_0.x = *pfVar1;
              pfVar1 = (float *)(r->field_2).m_p_u32;
              (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
              pfVar7[sVar10].field_0.field_0.y = *pfVar1;
            }
            else {
              r_qtexcoord(r,this->m_texcoords + sVar10);
              xr_reader::advance(r,4);
            }
            break;
          case '\x06':
            xr_reader::advance(r,3);
            fVar14 = xr_reader::r_float_q8(r,0.0,1.0);
            fVar14 = fVar14 * 0.0009765625;
            break;
          case '\a':
            xr_reader::advance(r,3);
            fVar15 = xr_reader::r_float_q8(r,0.0,1.0);
            fVar15 = fVar15 * 0.0009765625;
            break;
          case '\n':
            pfVar2 = this->m_colors;
            fVar13 = xr_reader::r_float_q8(r,-1.0,1.0);
            pfVar2[sVar10].r = fVar13;
            fVar13 = xr_reader::r_float_q8(r,-1.0,1.0);
            pfVar2[sVar10].g = fVar13;
            fVar13 = xr_reader::r_float_q8(r,-1.0,1.0);
            pfVar2[sVar10].b = fVar13;
            fVar13 = xr_reader::r_float_q8(r,-1.0,1.0);
            pfVar2[sVar10].a = fVar13;
          }
        }
        pfVar7 = this->m_texcoords;
        if (pfVar7 != (fvector2 *)0x0) {
          pfVar7[sVar10].field_0.field_0.x = fVar14 + pfVar7[sVar10].field_0.field_0.x;
          this->m_texcoords[sVar10].field_0.field_0.y =
               fVar15 + this->m_texcoords[sVar10].field_0.field_0.y;
        }
      }
      make_signature(this);
      return;
    }
    if (10 < ve[sVar10].usage) break;
    uVar5 = (uint)ve[sVar10].type;
    switch(ve[sVar10].usage) {
    case '\0':
      if (uVar5 != 2) {
        __assert_fail("type == D3D_VE_TYPE_FLOAT3",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                      ,0xa2,
                      "void xray_re::xr_vbuf::load_d3d9(xr_reader &, size_t, const d3d_vertex_element *, size_t)"
                     );
      }
      if (local_60 != (fvector3 *)0x0) {
        __assert_fail("m_points == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                      ,0xa3,
                      "void xray_re::xr_vbuf::load_d3d9(xr_reader &, size_t, const d3d_vertex_element *, size_t)"
                     );
      }
      local_60 = (fvector3 *)operator_new__(uVar9);
      this->m_points = local_60;
      break;
    default:
      goto switchD_001534eb_caseD_1;
    case '\x03':
      if (uVar5 != 4) {
        __assert_fail("type == D3D_VE_TYPE_D3DCOLOR",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                      ,0xa8,
                      "void xray_re::xr_vbuf::load_d3d9(xr_reader &, size_t, const d3d_vertex_element *, size_t)"
                     );
      }
      if (pfVar6 != (fvector3 *)0x0) {
        __assert_fail("m_normals == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                      ,0xa9,
                      "void xray_re::xr_vbuf::load_d3d9(xr_reader &, size_t, const d3d_vertex_element *, size_t)"
                     );
      }
      pfVar6 = (fvector3 *)operator_new__(uVar9);
      this->m_normals = pfVar6;
      break;
    case '\x05':
      if ((7 < uVar5) || ((0xc2U >> (uVar5 & 0x1f) & 1) == 0)) {
        __assert_fail("type == D3D_VE_TYPE_SHORT2 || type == D3D_VE_TYPE_SHORT4 || type == D3D_VE_TYPE_FLOAT2"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                      ,0xae,
                      "void xray_re::xr_vbuf::load_d3d9(xr_reader &, size_t, const d3d_vertex_element *, size_t)"
                     );
      }
      pfVar7 = (fvector2 *)operator_new__(-(ulong)(n >> 0x3d != 0) | n * 8);
      if (local_58 == (fvector2 *)0x0) {
        this->m_texcoords = pfVar7;
        local_58 = pfVar7;
      }
      else {
        this->m_lightmaps = pfVar7;
      }
      break;
    case '\x06':
    case '\a':
      if (uVar5 != 4) {
        __assert_fail("type == D3D_VE_TYPE_D3DCOLOR",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                      ,0xb7,
                      "void xray_re::xr_vbuf::load_d3d9(xr_reader &, size_t, const d3d_vertex_element *, size_t)"
                     );
      }
      break;
    case '\n':
      if (uVar5 != 4) {
        __assert_fail("type == D3D_VE_TYPE_D3DCOLOR",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                      ,0xbb,
                      "void xray_re::xr_vbuf::load_d3d9(xr_reader &, size_t, const d3d_vertex_element *, size_t)"
                     );
      }
      if (local_50 != (fcolor *)0x0) {
        __assert_fail("m_colors == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                      ,0xbc,
                      "void xray_re::xr_vbuf::load_d3d9(xr_reader &, size_t, const d3d_vertex_element *, size_t)"
                     );
      }
      local_50 = (fcolor *)operator_new__(-(ulong)(n >> 0x3c != 0) | n << 4);
      this->m_colors = local_50;
    }
    sVar10 = sVar10 + 1;
  }
switchD_001534eb_caseD_1:
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                ,0xc1,
                "void xray_re::xr_vbuf::load_d3d9(xr_reader &, size_t, const d3d_vertex_element *, size_t)"
               );
}

Assistant:

void xr_vbuf::load_d3d9(xr_reader& r, size_t n, const d3d_vertex_element ve[], size_t n_ve)
{
	clear();

	// validate vertex elements and create buffers
	for (size_t i = 0; i != n_ve; ++i) {
		unsigned type = ve[i].type;
		switch (ve[i].usage) {
		case D3D_VE_USAGE_POSITION:
			xr_assert(type == D3D_VE_TYPE_FLOAT3);
			xr_assert(m_points == 0);
			m_points = new fvector3[n];
			break;

		case D3D_VE_USAGE_NORMAL:
			xr_assert(type == D3D_VE_TYPE_D3DCOLOR);
			xr_assert(m_normals == 0);
			m_normals = new fvector3[n];
			break;

		case D3D_VE_USAGE_TEXCOORD:
			xr_assert(type == D3D_VE_TYPE_SHORT2 || type == D3D_VE_TYPE_SHORT4 || type == D3D_VE_TYPE_FLOAT2);
			if (m_texcoords == 0)
				m_texcoords = new fvector2[n];
			else
				m_lightmaps = new fvector2[n];
			break;

		case D3D_VE_USAGE_TANGENT:
		case D3D_VE_USAGE_BINORMAL:
			xr_assert(type == D3D_VE_TYPE_D3DCOLOR);
			break;

		case D3D_VE_USAGE_COLOR:
			xr_assert(type == D3D_VE_TYPE_D3DCOLOR);
			xr_assert(m_colors == 0);
			m_colors = new fcolor[n];
			break;

		default:
			xr_not_expected();
			break;
		}
	}

	fvector2 uv_fix;
	set_size(n);
	for (size_t i = 0; i != n; ++i) {
		unsigned tc = 0;
		uv_fix.set(0, 0);
		for (size_t j = 0; j != n_ve; ++j) {
			switch (ve[j].usage) {
			case D3D_VE_USAGE_POSITION:
				r.r_fvector3(m_points[i]);
				break;
			case D3D_VE_USAGE_NORMAL:
				r_qnormal(r, m_normals[i]);
				break;
			case D3D_VE_USAGE_TEXCOORD:
				switch (ve[j].type) {
				case D3D_VE_TYPE_FLOAT2:
					r.r_fvector2(++tc == 1 ? m_texcoords[i] : m_lightmaps[i]);
					break;
				case D3D_VE_TYPE_SHORT2:
					if (++tc == 1)
						r_qtexcoord(r, m_texcoords[i]);
					else
						r_qlightmap(r, m_lightmaps[i]);
					break;
				default:
				case D3D_VE_TYPE_SHORT4:
					r_qtexcoord(r, m_texcoords[i]);
					r.advance(2*sizeof(int16_t));
					break;
				}
				break;
			case D3D_VE_USAGE_TANGENT:
				r.advance(3*sizeof(uint8_t));
				uv_fix.x = r.r_float_q8()*(32.f/32768.f);
				break;
			case D3D_VE_USAGE_BINORMAL:
				r.advance(3*sizeof(uint8_t));
				uv_fix.y = r.r_float_q8()*(32.f/32768.f);
				break;
			case D3D_VE_USAGE_COLOR:
				r_qcolor(r, m_colors[i]);
				break;
			}
		}
		if (m_texcoords) {
			m_texcoords[i].x += uv_fix.x;
			m_texcoords[i].y += uv_fix.y;
		}
	}
	make_signature();
}